

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void INT_EVsubmit(EVsource source,void *data,attr_list attrs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _event_path_data *p_Var3;
  int iVar4;
  event_item *event;
  undefined8 uVar5;
  CMFormat p_Var6;
  attr_list p_Var7;
  long lVar8;
  CManager_conflict cm;
  undefined1 auVar9 [16];
  
  if (source->local_stone_id != -1) {
    p_Var3 = source->cm->evp;
    event = (event_item *)INT_CMmalloc(0x68);
    event->ref_count = 0;
    event->event_encoded = 0;
    *(undefined8 *)&event->contents = 0;
    event->encoded_event = (void *)0x0;
    event->event_len = 0;
    event->reference_format = (FMFormat)0x0;
    event->ioBuffer = (FFSBuffer)0x0;
    event->decoded_event = (void *)0x0;
    event->encoded_eventv = (FFSEncodeVector)0x0;
    event->format = (CMFormat)0x0;
    event->attrs = (attr_list)0x0;
    event->cm = (CManager_conflict)0x0;
    event->free_arg = (void *)0x0;
    event->free_func = (EVFreeFunction)0x0;
    event->ref_count = 1;
    event->event_len = -1;
    event->ioBuffer = (FFSBuffer)0x0;
    event->contents = (uint)(source->free_func != (EVFreeFunction)0x0);
    event->cm = source->cm;
    if (source->preencoded == 0) {
      event->event_encoded = 0;
      event->decoded_event = data;
      event->reference_format = source->reference_format;
      p_Var6 = source->format;
      lVar8 = 0x40;
    }
    else {
      event->event_encoded = 1;
      event->encoded_event = data;
      uVar5 = FFSTypeHandle_from_encode(p_Var3->ffsc,data);
      p_Var6 = (CMFormat)FMFormat_of_original(uVar5);
      lVar8 = 0x30;
    }
    *(CMFormat *)((long)&event->ref_count + lVar8) = p_Var6;
    uVar1 = source->free_func;
    uVar2 = source->free_data;
    auVar9._8_4_ = (int)uVar1;
    auVar9._0_8_ = uVar2;
    auVar9._12_4_ = (int)((ulong)uVar1 >> 0x20);
    event->free_arg = (void *)uVar2;
    event->free_func = (EVFreeFunction)auVar9._8_8_;
    p_Var7 = CMint_add_ref_attr_list
                       (source->cm,attrs,
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                        ,0xd6f);
    event->attrs = p_Var7;
    internal_path_submit(source->cm,source->local_stone_id,event);
    do {
      cm = source->cm;
      iVar4 = process_local_actions(cm);
    } while (iVar4 != 0);
    if ((event->ref_count != 1) && (event->contents == Event_App_Owned)) {
      cm = source->cm;
      event = reassign_memory_event(cm,event,1);
    }
    return_event((event_path_data)cm,event);
    return;
  }
  return;
}

Assistant:

void
INT_EVsubmit(EVsource source, void *data, attr_list attrs)
{
    event_path_data evp = source->cm->evp;
    event_item *event;
    if (source->local_stone_id == -1) return;  /* not connected */
    event = get_free_event(evp);
    if (source->free_func != NULL) {
	event->contents = Event_Freeable;
    } else {
	event->contents = Event_App_Owned;
    }
    event->cm = source->cm;
    if (source->preencoded) {
	event->event_encoded = 1;
	event->encoded_event = data;
	event->reference_format = FMFormat_of_original(FFSTypeHandle_from_encode(evp->ffsc, 
							    data));
    } else {
	event->event_encoded = 0;
	event->decoded_event = data;
	event->reference_format = source->reference_format;
	event->format = source->format;
    }
    event->free_func = source->free_func;
    event->free_arg = source->free_data;
    event->attrs = CMadd_ref_attr_list(source->cm, attrs);
    internal_path_submit(source->cm, source->local_stone_id, event);
    while (process_local_actions(source->cm));
    if (event->ref_count != 1 && (event->contents == Event_App_Owned)) {
	event = reassign_memory_event(source->cm, event, 1);  /* reassign memory */
    }
    return_event(source->cm->evp, event);
}